

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_server.h
# Opt level: O2

void __thiscall
rest_rpc::rpc_service::rpc_server::publish_by_token<person>
          (rpc_server *this,string *key,string *token,person *data)

{
  string sStack_98;
  string local_78;
  undefined1 local_58 [48];
  
  std::__cxx11::string::string((string *)&local_78,(string *)key);
  std::__cxx11::string::string((string *)&sStack_98,(string *)token);
  person::person((person *)local_58,data);
  publish<person>(this,&local_78,&sStack_98,(person *)local_58);
  std::__cxx11::string::~string((string *)(local_58 + 8));
  std::__cxx11::string::~string((string *)&sStack_98);
  std::__cxx11::string::~string((string *)&local_78);
  return;
}

Assistant:

void publish_by_token(const std::string &key, std::string token, T data) {
    publish(key, std::move(token), std::move(data));
  }